

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.cpp
# Opt level: O2

header_info *
anon_unknown.dwarf_7b780::sec_websocket_key
          (header_info *__return_storage_ptr__,header_info *hi,string *value)

{
  pstore::maybe<std::__cxx11::string,void>::operator=
            ((maybe<std::__cxx11::string,void> *)&hi->websocket_key,value);
  pstore::http::header_info::header_info(__return_storage_ptr__,hi);
  return __return_storage_ptr__;
}

Assistant:

header_info sec_websocket_key (header_info hi, std::string const & value) {
        hi.websocket_key = value;
        return hi;
    }